

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
::destroy(Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          *this)

{
  DataNode<robin_hood::detail::Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>,_true>
  *pDVar1;
  DataNode<robin_hood::detail::Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>,_true>
  *pDVar2;
  Destroyer<robin_hood::detail::Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>,_false>
  local_11;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *local_10;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *this_local;
  
  if (this->mMask != 0) {
    local_10 = this;
    Destroyer<robin_hood::detail::Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>,_false>
    ::nodesDoNotDeallocate(&local_11,this);
    pDVar1 = this->mKeyVals;
    pDVar2 = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>::DataNode<robin_hood::detail::Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>,true>*>
                       (&this->mMask);
    if (pDVar1 != pDVar2) {
      free(this->mKeyVals);
    }
  }
  return;
}

Assistant:

void destroy() {
        if (0 == mMask) {
            // don't deallocate!
            return;
        }

        Destroyer<Self, IsFlat && std::is_trivially_destructible<Node>::value>{}
            .nodesDoNotDeallocate(*this);

        // This protection against not deleting mMask shouldn't be needed as it's sufficiently
        // protected with the 0==mMask check, but I have this anyways because g++ 7 otherwise
        // reports a compile error: attempt to free a non-heap object 'fm'
        // [-Werror=free-nonheap-object]
        if (mKeyVals != reinterpret_cast_no_cast_align_warning<Node*>(&mMask)) {
            std::free(mKeyVals);
        }
    }